

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void datetimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  DateTime x;
  char zBuf [100];
  
  iVar1 = isDate(context,argc,argv,&x);
  if (iVar1 == 0) {
    computeYMD(&x);
    computeHMS(&x);
    sqlite3_snprintf(100,zBuf,"%04d-%02d-%02d %02d:%02d:%02d",(ulong)(uint)x.Y,(ulong)(uint)x.M,
                     (ulong)(uint)x.D,(ulong)(uint)x.h,(ulong)(uint)x.m,(ulong)(uint)(int)x.s);
    setResultStrOrError(context,zBuf,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return;
}

Assistant:

static void datetimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    char zBuf[100];
    computeYMD_HMS(&x);
    sqlite3_snprintf(sizeof(zBuf), zBuf, "%04d-%02d-%02d %02d:%02d:%02d",
                     x.Y, x.M, x.D, x.h, x.m, (int)(x.s));
    sqlite3_result_text(context, zBuf, -1, SQLITE_TRANSIENT);
  }
}